

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  reference stats;
  __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
  local_28;
  const_iterator itEnd;
  const_iterator it;
  SectionNode *sectionNode_local;
  JunitReporter *this_local;
  
  itEnd = std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::begin
                    (&sectionNode->assertions);
  local_28._M_current =
       (AssertionStats *)
       std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::end
                 (&sectionNode->assertions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_28);
    if (!bVar1) break;
    stats = __gnu_cxx::
            __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
            ::operator*(&itEnd);
    writeAssertion(this,stats);
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator++(&itEnd);
  }
  return;
}

Assistant:

void writeAssertions(SectionNode const& sectionNode) {
			for (SectionNode::Assertions::const_iterator
				it = sectionNode.assertions.begin(), itEnd = sectionNode.assertions.end();
				it != itEnd;
				++it)
				writeAssertion(*it);
		}